

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

void __thiscall CTPNStrOneOf::gen_code(CTPNStrOneOf *this,int discard,int for_condition)

{
  ushort uVar1;
  uint val_00;
  CTcSymObj *pCVar2;
  CTcPrsNode *pCVar3;
  CTcGenTarg *pCVar4;
  int iVar5;
  CTcSymbol *pCVar6;
  undefined8 *puVar7;
  undefined4 extraout_var;
  CTcCodeLabel *lbl;
  size_t __n;
  vm_obj_id_t vVar8;
  int iVar9;
  char *siz;
  ulong ofs;
  uint uVar10;
  CTPNList *pCVar11;
  char buf [5];
  vm_val_t val;
  
  siz = "getNextIndex";
  pCVar6 = CTcPrsSymtab::find_or_def_prop_explicit(G_prs->global_symtab_,"getNextIndex",0xc,0);
  if (*(int *)&(pCVar6->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.field_0x24 == 3
     ) {
    uVar1 = *(ushort *)
             &pCVar6[1].super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
              _vptr_CVmHashEntry;
    puVar7 = (undefined8 *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x30,(size_t)siz);
    *(undefined4 *)(puVar7 + 1) = 8;
    *(uint *)(puVar7 + 2) = (uint)uVar1;
    *(undefined1 *)(puVar7 + 5) = 0;
    *puVar7 = &PTR_gen_code_0030e698;
    iVar5 = (*(((this->super_CTPNStrOneOfBase).lst_)->super_CTPNListBase).super_CTcPrsNode.
              super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[1])();
    if (CONCAT44(extraout_var,iVar5) == 0) {
      pCVar2 = (this->super_CTPNStrOneOfBase).state_obj_;
      __n = 0;
      (*(pCVar2->super_CTcSymObjBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
        super_CVmHashEntry._vptr_CVmHashEntry[0x1e])(pCVar2,0,puVar7,0,0,0,0);
      val_00 = (((this->super_CTPNStrOneOfBase).lst_)->super_CTPNListBase).cnt_;
      CTcGenTarg::write_op(G_cg,0x90);
      CTcDataStream::write2(&G_cs->super_CTcDataStream,val_00);
      G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
      ofs = (G_cs->super_CTcDataStream).ofs_;
      uVar10 = 0;
      if (0 < (int)val_00) {
        uVar10 = val_00;
      }
      for (vVar8 = 1; vVar8 - uVar10 != 1; vVar8 = vVar8 + 1) {
        val.typ = VM_INT;
        val.val.obj = vVar8;
        vmb_put_dh(buf,&val);
        CTcDataStream::write(&G_cs->super_CTcDataStream,(int)buf,(void *)0x5,__n);
        CTcDataStream::write2(&G_cs->super_CTcDataStream,0);
      }
      CTcDataStream::write2(&G_cs->super_CTcDataStream,0);
      lbl = CTcCodeStream::new_label_fwd(G_cs);
      pCVar11 = (this->super_CTPNStrOneOfBase).lst_;
      iVar9 = -5 - (int)ofs;
      iVar5 = 1;
      while( true ) {
        pCVar11 = (CTPNList *)(pCVar11->super_CTPNListBase).head_;
        if ((pCVar11 == (CTPNList *)0x0) || ((int)val_00 < iVar5)) break;
        CTcDataStream::write2_at
                  (&G_cs->super_CTcDataStream,ofs + 5,(int)(G_cs->super_CTcDataStream).ofs_ + iVar9)
        ;
        pCVar3 = *(CTcPrsNode **)&(pCVar11->super_CTPNListBase).cnt_;
        (**(pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)
                  (pCVar3,discard,(ulong)(uint)for_condition);
        CTcGenTarg::write_op(G_cg,0x91);
        CTcCodeStream::write_ofs2(G_cs,lbl,0);
        if (discard == 0) {
          G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
        }
        iVar5 = iVar5 + 1;
        ofs = ofs + 7;
        iVar9 = iVar9 + -7;
      }
      CTcDataStream::write2_at
                (&G_cs->super_CTcDataStream,ofs,(int)(G_cs->super_CTcDataStream).ofs_ - (int)ofs);
      if (discard == 0) {
        CTcGenTarg::write_op(G_cg,'\b');
        pCVar4 = G_cg;
        iVar9 = G_cg->sp_depth_;
        iVar5 = iVar9 + 1;
        G_cg->sp_depth_ = iVar5;
        if (pCVar4->max_sp_depth_ <= iVar9) {
          pCVar4->max_sp_depth_ = iVar5;
        }
      }
      CTcPrsNode::def_label_pos(lbl);
    }
    else {
      pCVar11 = (this->super_CTPNStrOneOfBase).lst_;
      (**(pCVar11->super_CTPNListBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase)
                (pCVar11,0,0);
      pCVar2 = (this->super_CTPNStrOneOfBase).state_obj_;
      (*(pCVar2->super_CTcSymObjBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
        super_CVmHashEntry._vptr_CVmHashEntry[0x1e])(pCVar2,0,puVar7,0,0,0,0);
      CTcGenTarg::write_op(G_cg,0xba);
      G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
    }
    return;
  }
  CTcTokenizer::log_error(0x2d2c);
  return;
}

Assistant:

void CTPNStrOneOf::gen_code(int discard, int for_condition)
{
    /*
     *   There are two components to the <<one of>> list.  First, there's the
     *   list of strings.  Second, there's an anonymous OneOfIndexGen object
     *   that we create; this object holds our state and generates our index
     *   values.
     *   
     *   In the simple case, the list is just a constant list of constant
     *   strings.  However, if the enclosing string is a dstring, each of
     *   these will be a dstring; and even if the outer string is an sstring,
     *   these could contain further embedded expressions, in which case they
     *   won't be constant.
     *   
     *   If the list is constant, we generate list[generator.getNextIndex()].
     *   This selects a string from the list and leaves it on the stack,
     *   which is just what our parent node wants.
     *   
     *   If the list isn't constant, we generate a switch on
     *   generator.getNextIndex(), and then fill in the case table from the
     *   list: each case label is the index, and each case's body is the code
     *   generated for the list element, followed by a 'break' to the end of
     *   the switch.  The effect once again is to pick an item from the list
     *   and push its value onto the stack.  
     */

    /* look up the getNextIndex property */
    CTcSymProp *propsym = (CTcSymProp *)G_prs->get_global_symtab()->
                          find_or_def_prop_explicit("getNextIndex", 12, FALSE);
    if (propsym->get_type() != TC_SYM_PROP)
    {
        G_tok->log_error(TCERR_ONEOF_REQ_GETNXT);
        return;
    }

    /* synthesize a constant value for the property */
    CTcConstVal propc;
    propc.set_prop(propsym->get_prop());
    CTPNConst *getNextIndex = new CTPNConst(&propc);

    /* generate the list */
    CTcConstVal *c = lst_->get_const_val();
    if (c != 0)
    {
        /* the list is a constant - push the list value */
        lst_->gen_code(FALSE, FALSE);

        /* call generator.getNextIndex() to get the next index */
        state_obj_->gen_code_member(FALSE, getNextIndex, FALSE, 0, FALSE, 0);

        /* index the list (this pops two values and pushes one) */
        G_cg->write_op(OPC_INDEX);
        G_cg->note_pop();
    }
    else
    {
        /* the list is non-constant - start by generating the index */
        state_obj_->gen_code_member(FALSE, getNextIndex, FALSE, 0, FALSE, 0);

        /* note the number of list elements */
        int i, cnt = lst_->get_count();

        /* generate the SWITCH <case_cnt> */
        G_cg->write_op(OPC_SWITCH);
        G_cs->write2(cnt);
        G_cg->note_pop();

        /* 
         *   Build the case table.  Each label is an index value; leave the
         *   jump offset zero for now, since we'll have to fill it in as we
         *   generate the code. 
         */
        ulong caseofs = G_cs->get_ofs();
        for (i = 1 ; i <= cnt ; ++i)
        {
            /* write the case label as the 1-based index value */
            char buf[VMB_DATAHOLDER];
            vm_val_t val;
            val.set_int(i);
            vmb_put_dh(buf, &val);
            G_cs->write(buf, VMB_DATAHOLDER);

            /* write a placeholder for the jump offset */
            G_cs->write2(0);
        }

        /* write a placeholder for the default case */
        G_cs->write2(0);

        /* create a forward label for the 'break' to the end of the switch */
        CTcCodeLabel *brklbl = G_cs->new_label_fwd();

        /* 
         *   Now run through the table and generate the code for each list
         *   element. 
         */
        CTPNListEle *ele;
        for (i = 1, ele = lst_->get_head() ; ele != 0 && i <= cnt ;
             ++i, caseofs += VMB_DATAHOLDER + 2, ele = ele->get_next())
        {
            /* set the jump to this case in the case table */
            G_cs->write2_at(caseofs + VMB_DATAHOLDER,
                            G_cs->get_ofs() - (caseofs + VMB_DATAHOLDER));

            /* generate the code for this list element */
            ele->get_expr()->gen_code(discard, for_condition);;

            /* generate a jump to the end of the table */
            G_cg->write_op(OPC_JMP);
            G_cs->write_ofs2(brklbl, 0);

            /* 
             *   since all of these branches proceed in parallel, only one
             *   push counts, so don't count every iteration - pretend that
             *   we've already popped the value that this case generated 
             */
            if (!discard)
                G_cg->note_pop();
        }

        /* write the default case - just push nil */
        G_cs->write2_at(caseofs, G_cs->get_ofs() - caseofs);
        if (!discard)
        {
            G_cg->write_op(OPC_PUSHNIL);
            G_cg->note_push();
        }

        /* this is the end of the switch - set the 'break' label here */
        def_label_pos(brklbl);
    }
}